

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O2

_Bool mi_heap_page_never_delayed_free
                (mi_heap_t *heap,mi_page_queue_t *pq,mi_page_t *page,void *arg1,void *arg2)

{
  _mi_page_use_delayed_free(page,MI_NEVER_DELAYED_FREE,false);
  return true;
}

Assistant:

static bool mi_heap_page_never_delayed_free(mi_heap_t* heap, mi_page_queue_t* pq, mi_page_t* page, void* arg1, void* arg2) {
  MI_UNUSED(arg1);
  MI_UNUSED(arg2);
  MI_UNUSED(heap);
  MI_UNUSED(pq);
  _mi_page_use_delayed_free(page, MI_NEVER_DELAYED_FREE, false);
  return true; // don't break
}